

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O0

void test_87(QPDF *pdf,char *arg2)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_498;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>
  *local_430;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_3c0;
  JSON local_388;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_378;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_354;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_353;
  undefined1 local_352;
  allocator<char> local_351;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_350;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_348;
  iterator local_328;
  size_type local_320;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_318;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>
  local_293;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_292;
  undefined1 local_291;
  QPDFObjectHandle local_290;
  QPDFObjectHandle local_280;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>
  *local_270;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>
  local_268;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>
  local_238;
  iterator local_208;
  size_type local_200;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
  local_1f8;
  QPDFObjectHandle local_1c8;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1b8;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  QPDFObjectHandle local_130;
  allocator<char> local_119;
  string local_118 [36];
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_f4;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_f3;
  undefined1 local_f2;
  allocator<char> local_f1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  iterator local_c8;
  size_type local_c0;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b8;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  undefined1 local_28 [8];
  QPDFObjectHandle dict;
  char *arg2_local;
  QPDF *pdf_local;
  
  dict.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)arg2;
  operator____qpdf(local_28,0x1758da);
  QPDFObjectHandle::unparse_abi_cxx11_();
  bVar1 = std::operator==(&local_48,"<< /A 1 >>");
  if (!bVar1) {
    __assert_fail("dict.unparse() == \"<< /A 1 >>\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                  ,0xc26,"void test_87(QPDF &, const char *)");
  }
  std::__cxx11::string::~string((string *)&local_48);
  QPDFObjectHandle::getKeys_abi_cxx11_();
  local_f2 = 1;
  local_f0 = &local_e8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,"/A",&local_f1);
  local_f2 = 0;
  local_c8 = &local_e8;
  local_c0 = 1;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_f4);
  __l_01._M_len = local_c0;
  __l_01._M_array = local_c8;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&local_b8,__l_01,&local_f3,&local_f4);
  bVar1 = std::operator==(&local_88,&local_b8);
  if (!bVar1) {
    __assert_fail("dict.getKeys() == std::set<std::string>({\"/A\"})",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                  ,0xc27,"void test_87(QPDF &, const char *)");
  }
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set(&local_b8);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_f4);
  local_3c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_c8;
  do {
    local_3c0 = local_3c0 + -1;
    std::__cxx11::string::~string((string *)local_3c0);
  } while (local_3c0 != &local_e8);
  std::allocator<char>::~allocator(&local_f1);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set(&local_88);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_118,"/A",&local_119);
  QPDFObjectHandle::newNull();
  QPDFObjectHandle::replaceKey((string *)local_28,(QPDFObjectHandle *)local_118);
  QPDFObjectHandle::~QPDFObjectHandle(&local_130);
  std::__cxx11::string::~string(local_118);
  std::allocator<char>::~allocator(&local_119);
  QPDFObjectHandle::unparse_abi_cxx11_();
  bVar1 = std::operator==(&local_150,"<< >>");
  if (!bVar1) {
    __assert_fail("dict.unparse() == \"<< >>\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                  ,0xc29,"void test_87(QPDF &, const char *)");
  }
  std::__cxx11::string::~string((string *)&local_150);
  QPDFObjectHandle::getKeys_abi_cxx11_();
  local_1b8._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  local_1b8._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_1b8._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_1b8._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  local_1b8._M_t._M_impl._0_8_ = 0;
  local_1b8._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_1b8._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&local_1b8);
  bVar1 = std::operator==(&local_180,&local_1b8);
  if (!bVar1) {
    __assert_fail("dict.getKeys() == std::set<std::string>()",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                  ,0xc2a,"void test_87(QPDF &, const char *)");
  }
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set(&local_1b8);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set(&local_180);
  local_291 = 1;
  local_270 = &local_268;
  operator____qpdf((char *)&local_280,0x171b12);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>
  ::pair<const_char_(&)[3],_QPDFObjectHandle,_true>(&local_268,(char (*) [3])"/A",&local_280);
  local_270 = &local_238;
  QPDFObjectHandle::newNull();
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>
  ::pair<const_char_(&)[3],_QPDFObjectHandle,_true>(&local_238,(char (*) [3])"/B",&local_290);
  local_291 = 0;
  local_208 = &local_268;
  local_200 = 2;
  std::
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>
  ::allocator(&local_293);
  __l_00._M_len = local_200;
  __l_00._M_array = local_208;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
  ::map(&local_1f8,__l_00,&local_292,&local_293);
  QPDFObjectHandle::newDictionary((map *)&local_1c8);
  QPDFObjectHandle::operator=((QPDFObjectHandle *)local_28,&local_1c8);
  QPDFObjectHandle::~QPDFObjectHandle(&local_1c8);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
  ::~map(&local_1f8);
  std::
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>
  ::~allocator(&local_293);
  local_430 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>
               *)&local_208;
  do {
    local_430 = local_430 + -1;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>
    ::~pair(local_430);
  } while (local_430 != &local_268);
  QPDFObjectHandle::~QPDFObjectHandle(&local_290);
  QPDFObjectHandle::~QPDFObjectHandle(&local_280);
  QPDFObjectHandle::unparse_abi_cxx11_();
  bVar1 = std::operator==(&local_2b8,"<< /A 2 >>");
  if (!bVar1) {
    __assert_fail("dict.unparse() == \"<< /A 2 >>\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                  ,0xc2f,"void test_87(QPDF &, const char *)");
  }
  std::__cxx11::string::~string((string *)&local_2b8);
  QPDFObjectHandle::getKeys_abi_cxx11_();
  local_352 = 1;
  local_350 = &local_348;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_348,"/A",&local_351);
  local_352 = 0;
  local_328 = &local_348;
  local_320 = 1;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_354);
  __l._M_len = local_320;
  __l._M_array = local_328;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&local_318,__l,&local_353,&local_354);
  bVar1 = std::operator==(&local_2e8,&local_318);
  if (!bVar1) {
    __assert_fail("dict.getKeys() == std::set<std::string>({\"/A\"})",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                  ,0xc30,"void test_87(QPDF &, const char *)");
  }
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set(&local_318);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_354);
  local_498 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_328;
  do {
    local_498 = local_498 + -1;
    std::__cxx11::string::~string((string *)local_498);
  } while (local_498 != &local_348);
  std::allocator<char>::~allocator(&local_351);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set(&local_2e8);
  QPDFObjectHandle::getJSON((int)&local_388,SUB81(local_28,0));
  JSON::unparse_abi_cxx11_();
  bVar1 = std::operator==(&local_378,"{\n  \"/A\": 2\n}");
  if (!bVar1) {
    __assert_fail("dict.getJSON(JSON::LATEST).unparse() == \"{\\n  \\\"/A\\\": 2\\n}\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                  ,0xc31,"void test_87(QPDF &, const char *)");
  }
  std::__cxx11::string::~string((string *)&local_378);
  JSON::~JSON(&local_388);
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_28);
  return;
}

Assistant:

static void
test_87(QPDF& pdf, char const* arg2)
{
    // Explicitly demonstrate null dictionary values being the same as
    // missing keys.
    auto dict = "<< /A 1 /B null >>"_qpdf;
    assert(dict.unparse() == "<< /A 1 >>");
    assert(dict.getKeys() == std::set<std::string>({"/A"}));
    dict.replaceKey("/A", QPDFObjectHandle::newNull());
    assert(dict.unparse() == "<< >>");
    assert(dict.getKeys() == std::set<std::string>());
    dict = QPDFObjectHandle::newDictionary({
        {"/A", "2"_qpdf},
        {"/B", QPDFObjectHandle::newNull()},
    });
    assert(dict.unparse() == "<< /A 2 >>");
    assert(dict.getKeys() == std::set<std::string>({"/A"}));
    assert(dict.getJSON(JSON::LATEST).unparse() == "{\n  \"/A\": 2\n}");
}